

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

bool cmOutputConverter::ContainedInDirectory
               (string *param_1,string *remote_path,cmStateDirectory *directory)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  bool local_e1;
  bool local_d1;
  bool local_b1;
  allocator local_79;
  string local_78 [5];
  bool bothInSource;
  bool bothInBinary;
  string relativePathTopSource;
  allocator local_41;
  string local_40 [8];
  string relativePathTopBinary;
  cmStateDirectory *directory_local;
  string *remote_path_local;
  string *local_path_local;
  
  relativePathTopBinary.field_2._8_8_ = directory;
  pcVar2 = cmStateDirectory::GetRelativePathTopBinary(directory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar2,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pcVar2 = cmStateDirectory::GetRelativePathTopSource
                     ((cmStateDirectory *)relativePathTopBinary.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar2,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmOutputConverterNotAbove(pcVar2,pcVar3);
  local_b1 = false;
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_b1 = cmOutputConverterNotAbove(pcVar2,pcVar3);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmOutputConverterNotAbove(pcVar2,pcVar3);
  local_d1 = false;
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_d1 = cmOutputConverterNotAbove(pcVar2,pcVar3);
  }
  local_e1 = true;
  if (local_d1 == false) {
    local_e1 = local_b1;
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return local_e1;
}

Assistant:

bool cmOutputConverter::ContainedInDirectory(std::string const& local_path,
                                             std::string const& remote_path,
                                             cmStateDirectory const& directory)
{
  const std::string relativePathTopBinary =
    directory.GetRelativePathTopBinary();
  const std::string relativePathTopSource =
    directory.GetRelativePathTopSource();

  const bool bothInBinary =
    cmOutputConverterNotAbove(local_path.c_str(),
                              relativePathTopBinary.c_str()) &&
    cmOutputConverterNotAbove(remote_path.c_str(),
                              relativePathTopBinary.c_str());

  const bool bothInSource =
    cmOutputConverterNotAbove(local_path.c_str(),
                              relativePathTopSource.c_str()) &&
    cmOutputConverterNotAbove(remote_path.c_str(),
                              relativePathTopSource.c_str());

  return bothInSource || bothInBinary;
}